

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_parse_document_load_end(fy_parser *fyp,fy_document *fyd,fy_eventp *fyep)

{
  fy_atom *pfVar1;
  fy_token *fyt;
  fy_atom *handle;
  undefined1 auStack_d8 [56];
  char *local_a0;
  undefined1 auStack_98 [8];
  undefined1 local_90 [8];
  fy_diag_report_ctx _drc_1;
  fy_diag_report_ctx _drc;
  int rc;
  fy_event *fye;
  fy_eventp *fyep_local;
  fy_document *fyd_local;
  fy_parser *fyp_local;
  
  handle = (fy_atom *)auStack_98;
  if ((fyep == (fy_eventp *)0x0) && ((*(ushort *)&fyp->field_0x70 >> 4 & 1) != 0)) {
    local_a0 = (char *)0x12801e;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                   ,0x69b,"fy_parse_document_load_end","no event to process");
  }
  else if (fyep == (fy_eventp *)0x0) {
    _drc_1.override_line = 4;
    _drc_1.override_column = 4;
    handle = (fy_atom *)auStack_d8;
    pfVar1 = fy_fill_atom_at(fyp,0,0,handle);
    fy_token_create(FYTT_INPUT_MARKER,pfVar1);
    fy_parser_diag_report
              (fyp,(fy_diag_report_ctx *)&_drc_1.override_line,"premature end of event stream");
  }
  else {
    local_a0 = fy_event_type_txt[(fyep->e).type];
    auStack_d8._48_8_ = "fy_parse_document_load_end";
    auStack_d8._40_8_ = (fy_input *)0x1280e6;
    fy_parser_diag(fyp,0x40,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                   ,0x6a1,"fy_parse_document_load_end","in %s [%s]");
    handle = (fy_atom *)auStack_98;
    if ((fyep->e).type == FYET_DOCUMENT_END) {
      local_a0 = (char *)0x128167;
      fy_parse_eventp_recycle(fyp,fyep);
      return 0;
    }
    local_a0 = (char *)0x128114;
    memset(local_90,0,0x28);
    local_90._0_4_ = FYET_ERROR;
    local_90._4_4_ = FYEM_DOC;
    local_a0 = (char *)0x128131;
    fyt = fy_document_event_get_token(&fyep->e);
    local_a0 = (char *)0x128139;
    _drc_1._0_8_ = fy_token_ref(fyt);
    local_a0 = (char *)0x128156;
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)local_90,"bad event");
  }
  *(undefined8 *)&handle[-1].increment = 0x128184;
  fy_parse_eventp_recycle(fyp,fyep);
  return -1;
}

Assistant:

int fy_parse_document_load_end(struct fy_parser *fyp, struct fy_document *fyd, struct fy_eventp *fyep) {
    struct fy_event *fye;
    int rc;

    fyp_error_check(fyp, fyep || !fyp->stream_error, err_out,
                    "no event to process");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 0, FYEM_DOC,
                          fyep, err_out,
                          "premature end of event stream");

    fyp_doc_debug(fyp, "in %s [%s]", __func__, fy_event_type_txt[fyep->e.type]);

    fye = &fyep->e;

    FYP_TOKEN_ERROR_CHECK(fyp, fy_document_event_get_token(fye), FYEM_DOC,
                          fye->type == FYET_DOCUMENT_END, err_out,
                          "bad event");

    /* recycle the document end event */
    fy_parse_eventp_recycle(fyp, fyep);

    return 0;
    err_out:
    rc = -1;
    fy_parse_eventp_recycle(fyp, fyep);
    return rc;
}